

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O2

Map_Cut_t * Map_CutListAppend(Map_Cut_t *pSetAll,Map_Cut_t *pSets)

{
  Map_Cut_t *pMVar1;
  Map_Cut_t *pMVar2;
  
  pMVar1 = pSets;
  if ((pSetAll != (Map_Cut_t *)0x0) && (pMVar1 = pSetAll, pSets != (Map_Cut_t *)0x0)) {
    pMVar1 = (Map_Cut_t *)0x0;
    for (pMVar2 = pSets; pMVar2 != (Map_Cut_t *)0x0; pMVar2 = pMVar2->pNext) {
      pMVar1 = pMVar2;
    }
    if (pMVar1->pNext != (Map_Cut_t *)0x0) {
      __assert_fail("pPrev->pNext == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperCutUtils.c"
                    ,0xb1,"Map_Cut_t *Map_CutListAppend(Map_Cut_t *, Map_Cut_t *)");
    }
    pMVar1->pNext = pSetAll;
    pMVar1 = pSets;
  }
  return pMVar1;
}

Assistant:

Map_Cut_t * Map_CutListAppend( Map_Cut_t * pSetAll, Map_Cut_t * pSets )
{
    Map_Cut_t * pPrev = NULL; // Suppress "might be used uninitialized"
    Map_Cut_t * pTemp;
    if ( pSetAll == NULL )
        return pSets;
    if ( pSets == NULL )
        return pSetAll;
    // find the last one
    for ( pTemp = pSets; pTemp; pTemp = pTemp->pNext )
        pPrev = pTemp;
    // append all the end of the current set
    assert( pPrev->pNext == NULL );
    pPrev->pNext = pSetAll;
    return pSets;
}